

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall google::protobuf::Reflection::Swap(Reflection *this,Message *lhs,Message *rhs)

{
  char *pcVar1;
  MessageLite *from;
  MessageLite *pMVar2;
  Nonnull<const_char_*> pcVar3;
  LogMessage *pLVar4;
  Arena *pAVar5;
  Arena *arena;
  string_view str;
  string_view v;
  string_view str_00;
  string_view v_00;
  string_view str_01;
  string_view v_01;
  string_view str_02;
  string_view v_02;
  Metadata MVar6;
  LogMessage local_40;
  
  if (lhs != rhs) {
    do {
      pAVar5 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      MVar6 = Message::GetMetadata(lhs);
      if (MVar6.reflection != this) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                           (MVar6.reflection,this,"lhs->GetReflection() == this");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x459,pcVar3);
        str._M_str = "First argument to Swap() (of type \"";
        str._M_len = 0x23;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_40,str);
        MVar6 = Message::GetMetadata(lhs);
        pcVar1 = ((MVar6.descriptor)->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
        v._M_str = pcVar1 + ~v._M_len;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,v);
        str_00._M_str = "\") is not compatible with this reflection object (which is for type \"";
        str_00._M_len = 0x45;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar4,str_00);
        pcVar1 = (this->descriptor_->all_names_).payload_;
        v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
        v_00._M_str = pcVar1 + ~v_00._M_len;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,v_00);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (pLVar4,(char (*) [79])
                          "\").  Note that the exact same class is required; not just the same descriptor."
                  );
LAB_002974a4:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      MVar6 = Message::GetMetadata(rhs);
      if (MVar6.reflection != this) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                           (MVar6.reflection,this,"rhs->GetReflection() == this");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x461,pcVar3);
        str_01._M_str = "Second argument to Swap() (of type \"";
        str_01._M_len = 0x24;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_40,str_01);
        MVar6 = Message::GetMetadata(rhs);
        pcVar1 = ((MVar6.descriptor)->all_names_).payload_;
        v_01._M_len = (ulong)*(ushort *)(pcVar1 + 2);
        v_01._M_str = pcVar1 + ~v_01._M_len;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,v_01);
        str_02._M_str = "\") is not compatible with this reflection object (which is for type \"";
        str_02._M_len = 0x45;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar4,str_02);
        pcVar1 = (this->descriptor_->all_names_).payload_;
        v_02._M_len = (ulong)*(ushort *)(pcVar1 + 2);
        v_02._M_str = pcVar1 + ~v_02._M_len;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,v_02);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (pLVar4,(char (*) [79])
                          "\").  Note that the exact same class is required; not just the same descriptor."
                  );
        goto LAB_002974a4;
      }
      if (pAVar5 == arena) {
        UnsafeArenaSwap(this,lhs,rhs);
        return;
      }
      from = &lhs->super_MessageLite;
      pMVar2 = &rhs->super_MessageLite;
      if (pAVar5 != (Arena *)0x0) {
        arena = pAVar5;
        from = &rhs->super_MessageLite;
        pMVar2 = &lhs->super_MessageLite;
      }
      lhs = (Message *)pMVar2;
      rhs = (Message *)MessageLite::New(&lhs->super_MessageLite,arena);
      Message::MergeFrom(rhs,(Message *)from);
      Message::CopyFrom((Message *)from,lhs);
    } while (lhs != rhs);
  }
  return;
}

Assistant:

void Reflection::Swap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();

  // TODO:  Other Reflection methods should probably check this too.
  ABSL_CHECK_EQ(lhs->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << lhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  ABSL_CHECK_EQ(rhs->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << rhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (!internal::CanUseInternalSwap(lhs_arena, rhs_arena)) {
    // One of the two is guaranteed to have an arena.  Switch things around
    // to guarantee that lhs has an arena.
    Arena* arena = lhs_arena;
    if (arena == nullptr) {
      arena = rhs_arena;
      std::swap(lhs, rhs);  // Swapping names for pointers!
    }

    Message* temp = lhs->New(arena);
    temp->MergeFrom(*rhs);
    rhs->CopyFrom(*lhs);
    if (internal::DebugHardenForceCopyInSwap()) {
      lhs->CopyFrom(*temp);
      if (arena == nullptr) delete temp;
    } else {
      Swap(lhs, temp);
    }
    return;
  }

  UnsafeArenaSwap(lhs, rhs);
}